

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Vec_Int_t * Gia_ManSimPatStart(int nItems)

{
  Vec_Int_t *p;
  
  p = Vec_IntAlloc(nItems);
  Vec_IntPush(p,0x11);
  Vec_IntPush(p,0x27);
  Vec_IntPush(p,0x38);
  Vec_IntPush(p,0xdd);
  return p;
}

Assistant:

Vec_Int_t * Gia_ManSimPatStart( int nItems )
{
    Vec_Int_t * vValues = Vec_IntAlloc( nItems );
    Vec_IntPush( vValues, 17 );
    Vec_IntPush( vValues, 39 );
    Vec_IntPush( vValues, 56 );
    Vec_IntPush( vValues, 221 );
    return vValues;
}